

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O0

void __thiscall kj::std::anon_unknown_0::TestCase64::run(TestCase64 *this)

{
  bool bVar1;
  anon_class_16_2_74ab4c39 *func;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<unsigned_char> AVar3;
  ArrayPtr<unsigned_char> local_448;
  ArrayPtr<unsigned_char> local_438;
  ArrayPtr<const_unsigned_char> local_428;
  bool local_411;
  undefined1 auStack_410 [7];
  bool _kj_shouldLog;
  size_t local_408;
  ArrayPtr<unsigned_char> local_400;
  ArrayPtr<const_unsigned_char> local_3f0;
  ArrayPtr<const_unsigned_char> local_3e0;
  undefined1 local_3d0 [8];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> _kjCondition_1;
  Fault f;
  undefined1 *puStack_388;
  DebugExpression<bool> _kjCondition;
  undefined1 local_378 [8];
  Maybe<kj::Exception> e;
  byte buf [8];
  undefined1 local_1c8 [8];
  StdOutputStream out;
  undefined1 local_1a8 [8];
  StdInputStream in;
  stringstream ss;
  ostream local_188 [376];
  TestCase64 *local_10;
  TestCase64 *this_local;
  
  local_10 = this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&in.stream_);
  StdInputStream::StdInputStream((StdInputStream *)local_1a8,(istream *)&in.stream_);
  StdOutputStream::StdOutputStream((StdOutputStream *)local_1c8,local_188);
  AVar2 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
  StdOutputStream::write
            ((StdOutputStream *)local_1c8,(int)AVar2.ptr,(void *)AVar2.size_,(size_t)AVar2.ptr);
  e.ptr.field_1.value.details.builder.disposer = (ArrayDisposer *)0x0;
  puStack_388 = local_1a8;
  runCatchingExceptions<kj::std::(anonymous_namespace)::TestCase64::run()::__0>
            ((Maybe<kj::Exception> *)local_378,(kj *)&stack0xfffffffffffffc78,func);
  bVar1 = Maybe<kj::Exception>::operator==((Maybe<kj::Exception> *)local_378);
  f.exception._6_1_ = ~bVar1 & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    local_3f0 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
    local_3e0 = (ArrayPtr<const_unsigned_char>)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f0);
    _auStack_410 = arrayPtr<unsigned_char,8ul>((uchar (*) [8])((long)&e.ptr.field_1 + 0x188));
    local_400 = ArrayPtr<unsigned_char>::first((ArrayPtr<unsigned_char> *)auStack_410,6);
    kj::_::DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
              ((DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> *)
               local_3d0,(DebugExpression<kj::ArrayPtr<unsigned_char_const>> *)&local_3e0,&local_400
              );
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d0);
    if (!bVar1) {
      local_411 = kj::_::Debug::shouldLog(ERROR);
      while (local_411 != false) {
        AVar2 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
        local_428 = AVar2;
        AVar3 = arrayPtr<unsigned_char,8ul>((uchar (*) [8])((long)&e.ptr.field_1 + 0x188));
        local_448 = AVar3;
        AVar3 = ArrayPtr<unsigned_char>::first(&local_448,6);
        local_438 = AVar3;
        kj::_::Debug::
        log<char_const(&)[60],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
                   ,0x54,ERROR,
                   "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf).first(6))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf).first(6)"
                   ,(char (*) [60])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf).first(6))",
                   (DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_>
                    *)local_3d0,&local_428,&local_438);
        local_411 = false;
      }
    }
    Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_378);
    StdOutputStream::~StdOutputStream((StdOutputStream *)local_1c8);
    StdInputStream::~StdInputStream((StdInputStream *)local_1a8);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&in.stream_);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&_kjCondition_1.result,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
             ,0x51,FAILED,"!(e == kj::none)","_kjCondition,",
             (DebugExpression<bool> *)((long)&f.exception + 7));
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
}

Assistant:

TEST(StdIoStream, ReadToEndOfFile) {
  // Check that read throws an exception when eof is reached before specified
  // bytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  out.write("foobar"_kjb);

  byte buf[8]{};

  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    in.read(buf);
  });

  ASSERT_FALSE(e == kj::none);

  // Ensure that the value is still read up to the EOF.
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf).first(6));
}